

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpinfo.c
# Opt level: O0

WebPInfoStatus
ParseLossySegmentHeader(WebPInfo *webp_info,uint8_t *data,size_t data_size,uint64_t *bit_pos)

{
  int iVar1;
  int iVar2;
  uint64_t *in_RCX;
  size_t in_RDX;
  uint8_t *in_RSI;
  long in_RDI;
  int bit_2;
  int prob_segment [3];
  int i_1;
  int bit_1;
  int bit;
  int filter_strength [4];
  int quantizer [4];
  int a_delta;
  int i;
  int update_data;
  int update_map;
  int use_segment;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int *in_stack_ffffffffffffff80;
  ulong uVar3;
  undefined4 in_stack_ffffffffffffff88;
  uint uVar4;
  undefined4 in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  uint in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_3c;
  int local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint64_t *local_28;
  size_t local_20;
  uint8_t *local_18;
  long local_10;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar1 = GetBits(in_RSI,in_RDX,1,(int *)&local_2c,in_RCX);
  if (iVar1 == 0) {
    if (*(int *)(local_10 + 0x70) != 0) {
      fprintf(_stderr,"Error: %s\n","Truncated lossy bitstream.");
    }
    return WEBP_INFO_TRUNCATED_DATA;
  }
  printf("  Use segment:      %d\n",(ulong)local_2c);
  if (local_2c != 0) {
    iVar1 = GetBits(local_18,local_20,1,(int *)&local_30,local_28);
    if (iVar1 == 0) {
      if (*(int *)(local_10 + 0x70) != 0) {
        fprintf(_stderr,"Error: %s\n","Truncated lossy bitstream.");
      }
      return WEBP_INFO_TRUNCATED_DATA;
    }
    iVar1 = GetBits(local_18,local_20,1,(int *)&local_34,local_28);
    if (iVar1 == 0) {
      if (*(int *)(local_10 + 0x70) != 0) {
        fprintf(_stderr,"Error: %s\n","Truncated lossy bitstream.");
      }
      return WEBP_INFO_TRUNCATED_DATA;
    }
    printf("  Update map:       %d\n  Update data:      %d\n",(ulong)local_30,(ulong)local_34);
    if (local_34 != 0) {
      memset(&local_58,0,0x10);
      memset(&stack0xffffffffffffff98,0,0x10);
      iVar1 = GetBits(local_18,local_20,1,(int *)&local_3c,local_28);
      if (iVar1 == 0) {
        if (*(int *)(local_10 + 0x70) != 0) {
          fprintf(_stderr,"Error: %s\n","Truncated lossy bitstream.");
        }
        return WEBP_INFO_TRUNCATED_DATA;
      }
      printf("  Absolute delta:   %d\n",(ulong)local_3c);
      for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
        iVar1 = GetBits(local_18,local_20,1,(int *)&stack0xffffffffffffff94,local_28);
        if (iVar1 == 0) {
          if (*(int *)(local_10 + 0x70) != 0) {
            fprintf(_stderr,"Error: %s\n","Truncated lossy bitstream.");
          }
          return WEBP_INFO_TRUNCATED_DATA;
        }
        if ((in_stack_ffffffffffffff94 != 0) &&
           (iVar1 = GetSignedBits((uint8_t *)
                                  CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                                  CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                  CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                                  in_stack_ffffffffffffff80,
                                  (uint64_t *)
                                  CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)),
           iVar1 == 0)) {
          if (*(int *)(local_10 + 0x70) != 0) {
            fprintf(_stderr,"Error: %s\n","Truncated lossy bitstream.");
          }
          return WEBP_INFO_TRUNCATED_DATA;
        }
      }
      for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
        iVar1 = GetBits(local_18,local_20,1,(int *)&stack0xffffffffffffff90,local_28);
        if (iVar1 == 0) {
          if (*(int *)(local_10 + 0x70) != 0) {
            fprintf(_stderr,"Error: %s\n","Truncated lossy bitstream.");
          }
          return WEBP_INFO_TRUNCATED_DATA;
        }
        if ((in_stack_ffffffffffffff90 != 0) &&
           (iVar1 = GetSignedBits((uint8_t *)
                                  CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                                  CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                  CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                                  in_stack_ffffffffffffff80,
                                  (uint64_t *)
                                  CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)),
           iVar1 == 0)) {
          if (*(int *)(local_10 + 0x70) != 0) {
            fprintf(_stderr,"Error: %s\n","Truncated lossy bitstream.");
          }
          return WEBP_INFO_TRUNCATED_DATA;
        }
      }
      printf("  Quantizer:        %d %d %d %d\n",(ulong)local_58,(ulong)local_54,(ulong)local_50,
             (ulong)local_4c);
      printf("  Filter strength:  %d %d %d %d\n",(ulong)in_stack_ffffffffffffff98,
             (ulong)in_stack_ffffffffffffff9c,(ulong)local_60,(ulong)local_5c);
    }
    if (local_30 != 0) {
      uVar3 = 0xff000000ff;
      uVar4 = 0xff;
      for (iVar1 = 0; iVar1 < 3; iVar1 = iVar1 + 1) {
        iVar2 = GetBits(local_18,local_20,1,(int *)&stack0xffffffffffffff7c,local_28);
        if (iVar2 == 0) {
          if (*(int *)(local_10 + 0x70) != 0) {
            fprintf(_stderr,"Error: %s\n","Truncated lossy bitstream.");
          }
          return WEBP_INFO_TRUNCATED_DATA;
        }
        if ((in_stack_ffffffffffffff7c != 0) &&
           (iVar2 = GetBits(local_18,local_20,8,(int *)(&stack0xffffffffffffff80 + (long)iVar1 * 4),
                            local_28), iVar2 == 0)) {
          if (*(int *)(local_10 + 0x70) != 0) {
            fprintf(_stderr,"Error: %s\n","Truncated lossy bitstream.");
          }
          return WEBP_INFO_TRUNCATED_DATA;
        }
      }
      printf("  Prob segment:     %d %d %d\n",uVar3 & 0xffffffff,uVar3 >> 0x20,(ulong)uVar4);
    }
  }
  return WEBP_INFO_OK;
}

Assistant:

static WebPInfoStatus ParseLossySegmentHeader(const WebPInfo* const webp_info,
                                              const uint8_t* const data,
                                              size_t data_size,
                                              uint64_t* const bit_pos) {
  int use_segment;
  GET_BITS(use_segment, 1);
  printf("  Use segment:      %d\n", use_segment);
  if (use_segment) {
    int update_map, update_data;
    GET_BITS(update_map, 1);
    GET_BITS(update_data, 1);
    printf("  Update map:       %d\n"
           "  Update data:      %d\n",
           update_map, update_data);
    if (update_data) {
      int i, a_delta;
      int quantizer[4] = {0, 0, 0, 0};
      int filter_strength[4] = {0, 0, 0, 0};
      GET_BITS(a_delta, 1);
      printf("  Absolute delta:   %d\n", a_delta);
      for (i = 0; i < 4; ++i) {
        int bit;
        GET_BITS(bit, 1);
        if (bit) GET_SIGNED_BITS(quantizer[i], 7);
      }
      for (i = 0; i < 4; ++i) {
        int bit;
        GET_BITS(bit, 1);
        if (bit) GET_SIGNED_BITS(filter_strength[i], 6);
      }
      printf("  Quantizer:        %d %d %d %d\n", quantizer[0], quantizer[1],
             quantizer[2], quantizer[3]);
      printf("  Filter strength:  %d %d %d %d\n", filter_strength[0],
             filter_strength[1], filter_strength[2], filter_strength[3]);
    }
    if (update_map) {
      int i;
      int prob_segment[3] = {255, 255, 255};
      for (i = 0; i < 3; ++i) {
        int bit;
        GET_BITS(bit, 1);
        if (bit) GET_BITS(prob_segment[i], 8);
      }
      printf("  Prob segment:     %d %d %d\n",
             prob_segment[0], prob_segment[1], prob_segment[2]);
    }
  }
  return WEBP_INFO_OK;
}